

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void __thiscall cppcms::xss::basic_rules_holder::add_entity(basic_rules_holder *this,string *name)

{
  value_type *in_stack_ffffffffffffff98;
  c_string *in_stack_ffffffffffffffa0;
  
  details::c_string::c_string(in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98);
  std::
  set<cppcms::xss::details::c_string,_cppcms::xss::compare_c_string,_std::allocator<cppcms::xss::details::c_string>_>
  ::insert((set<cppcms::xss::details::c_string,_cppcms::xss::compare_c_string,_std::allocator<cppcms::xss::details::c_string>_>
            *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  details::c_string::~c_string((c_string *)0x46040f);
  return;
}

Assistant:

void add_entity(std::string const &name)
		{
			entities.insert(c_string(name));
		}